

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

FullType flatbuffers::anon_unknown_26::GetFullType(Type *type)

{
  BaseType BVar1;
  FullType FVar2;
  Type local_20;
  
  BVar1 = type->base_type;
  switch(BVar1) {
  case BASE_TYPE_STRING:
    FVar2 = ftString;
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    local_20.base_type = type->element;
    local_20.fixed_length = type->fixed_length;
    local_20.element = BASE_TYPE_NONE;
    local_20.struct_def = type->struct_def;
    local_20.enum_def = type->enum_def;
    FVar2 = GetFullType(&local_20);
    switch(FVar2) {
    case ftInteger:
      FVar2 = ftVectorOfInteger;
      break;
    case ftFloat:
      FVar2 = ftVectorOfFloat;
      break;
    case ftBool:
      FVar2 = ftVectorOfBool;
      break;
    case ftStruct:
      FVar2 = ftVectorOfStruct;
      break;
    case ftTable:
      FVar2 = ftVectorOfTable;
      break;
    case ftEnumKey:
      FVar2 = ftVectorOfEnumKey;
      break;
    case ftUnionKey:
    case ftUnionValue:
      __assert_fail("false && \"vectors of unions are unsupported\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                    ,0xd9,"FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
    case ftString:
      FVar2 = ftVectorOfString;
      break;
    default:
      __assert_fail("false && \"vector of vectors are unsupported\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                    ,0xdd,"FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
    }
    break;
  case BASE_TYPE_STRUCT:
    FVar2 = ftTable - type->struct_def->fixed;
    break;
  default:
    if (type->enum_def == (EnumDef *)0x0) {
      if (0xb < BVar1 - BASE_TYPE_UTYPE) {
        __assert_fail("false && \"completely unknown type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                      ,0x109,
                      "FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
      }
      if (BVar1 == BASE_TYPE_BOOL) {
        FVar2 = ftBool;
      }
      else {
        FVar2 = (FullType)(9 < BVar1 - BASE_TYPE_UTYPE);
      }
    }
    else if (type->enum_def->is_union == true) {
      if (BVar1 == BASE_TYPE_UNION) {
        FVar2 = ftUnionValue;
      }
      else {
        if (9 < BVar1 - BASE_TYPE_UTYPE) {
          __assert_fail("false && \"unknown union field type\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                        ,0xf8,
                        "FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
        }
        FVar2 = ftUnionKey;
      }
    }
    else {
      FVar2 = ftEnumKey;
    }
    break;
  case BASE_TYPE_ARRAY:
    local_20.base_type = type->element;
    local_20.fixed_length = type->fixed_length;
    local_20.element = BASE_TYPE_NONE;
    local_20.struct_def = type->struct_def;
    local_20.enum_def = type->enum_def;
    FVar2 = GetFullType(&local_20);
    if ((ftEnumKey < FVar2) ||
       ((0x2fU >> (FVar2 & (ftVectorOfUnionValue|ftVectorOfString)) & 1) == 0)) {
      __assert_fail("false && \"Unsupported type for fixed array\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                    ,0xee,"FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
    }
    FVar2 = *(FullType *)(&DAT_002770a0 + (ulong)FVar2 * 4);
  }
  return FVar2;
}

Assistant:

static FullType GetFullType(const Type &type) {
  // N.B. The order of these conditionals matters for some types.

  if (IsString(type)) {
    return ftString;
  } else if (type.base_type == BASE_TYPE_STRUCT) {
    if (type.struct_def->fixed) {
      return ftStruct;
    } else {
      return ftTable;
    }
  } else if (IsVector(type)) {
    switch (GetFullType(type.VectorType())) {
      case ftInteger: {
        return ftVectorOfInteger;
      }
      case ftFloat: {
        return ftVectorOfFloat;
      }
      case ftBool: {
        return ftVectorOfBool;
      }
      case ftStruct: {
        return ftVectorOfStruct;
      }
      case ftTable: {
        return ftVectorOfTable;
      }
      case ftString: {
        return ftVectorOfString;
      }
      case ftEnumKey: {
        return ftVectorOfEnumKey;
      }
      case ftUnionKey:
      case ftUnionValue: {
        FLATBUFFERS_ASSERT(false && "vectors of unions are unsupported");
        break;
      }
      default: {
        FLATBUFFERS_ASSERT(false && "vector of vectors are unsupported");
      }
    }
  } else if (IsArray(type)) {
    switch (GetFullType(type.VectorType())) {
      case ftInteger:
      case ftFloat:
      case ftBool: {
        return ftArrayOfBuiltin;
      }
      case ftStruct: {
        return ftArrayOfStruct;
      }
      case ftEnumKey: {
        return ftArrayOfEnum;
      }
      default: {
        FLATBUFFERS_ASSERT(false && "Unsupported type for fixed array");
      }
    }
  } else if (type.enum_def != nullptr) {
    if (type.enum_def->is_union) {
      if (type.base_type == BASE_TYPE_UNION) {
        return ftUnionValue;
      } else if (IsInteger(type.base_type)) {
        return ftUnionKey;
      } else {
        FLATBUFFERS_ASSERT(false && "unknown union field type");
      }
    } else {
      return ftEnumKey;
    }
  } else if (IsScalar(type.base_type)) {
    if (IsBool(type.base_type)) {
      return ftBool;
    } else if (IsInteger(type.base_type)) {
      return ftInteger;
    } else if (IsFloat(type.base_type)) {
      return ftFloat;
    } else {
      FLATBUFFERS_ASSERT(false && "unknown number type");
    }
  }

  FLATBUFFERS_ASSERT(false && "completely unknown type");

  // this is only to satisfy the compiler's return analysis.
  return ftBool;
}